

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

void icu_63::number::impl::blueprint_helpers::generateMeasureUnitOption
               (MeasureUnit *measureUnit,UnicodeString *sb,UErrorCode *param_3)

{
  UErrorCode *this;
  char *pcVar1;
  UnicodeString local_b0;
  UnicodeString local_60;
  UErrorCode *local_20;
  UErrorCode *param_2_local;
  UnicodeString *sb_local;
  MeasureUnit *measureUnit_local;
  
  local_20 = param_3;
  param_2_local = (UErrorCode *)sb;
  sb_local = (UnicodeString *)measureUnit;
  pcVar1 = MeasureUnit::getType(measureUnit);
  UnicodeString::UnicodeString(&local_60,pcVar1,-1,kInvariant);
  UnicodeString::append(sb,&local_60);
  UnicodeString::~UnicodeString(&local_60);
  UnicodeString::append((UnicodeString *)param_2_local,L'-');
  this = param_2_local;
  pcVar1 = MeasureUnit::getSubtype((MeasureUnit *)sb_local);
  UnicodeString::UnicodeString(&local_b0,pcVar1,-1,kInvariant);
  UnicodeString::append((UnicodeString *)this,&local_b0);
  UnicodeString::~UnicodeString(&local_b0);
  return;
}

Assistant:

void blueprint_helpers::generateMeasureUnitOption(const MeasureUnit& measureUnit, UnicodeString& sb,
                                                  UErrorCode&) {
    // Need to do char <-> UChar conversion...
    sb.append(UnicodeString(measureUnit.getType(), -1, US_INV));
    sb.append(u'-');
    sb.append(UnicodeString(measureUnit.getSubtype(), -1, US_INV));
}